

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O0

void __thiscall
RegressionTree::RegressionTree
          (RegressionTree *this,shared_ptr<Launcher> *launcher,bool classification)

{
  byte in_DL;
  undefined8 *in_RDI;
  Launcher *in_stack_ffffffffffffff68;
  Launcher *this_00;
  Application *in_stack_ffffffffffffff70;
  string *this_01;
  byte local_11;
  
  local_11 = in_DL & 1;
  Application::Application(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__RegressionTree_0037fa10;
  *(byte *)(in_RDI + 10) = local_11 & 1;
  this_01 = (string *)(in_RDI + 0xb);
  std::__cxx11::string::string(this_01);
  std::shared_ptr<QueryCompiler>::shared_ptr((shared_ptr<QueryCompiler> *)0x204c75);
  std::shared_ptr<TreeDecomposition>::shared_ptr((shared_ptr<TreeDecomposition> *)0x204c8b);
  std::bitset<100UL>::bitset((bitset<100UL> *)0x204c9c);
  std::bitset<100UL>::bitset((bitset<100UL> *)0x204cad);
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x204cef);
  std::vector<Function_*,_std::allocator<Function_*>_>::vector
            ((vector<Function_*,_std::allocator<Function_*>_> *)0x204d05);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x204d1b);
  in_RDI[0x25] = 0;
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)0x204d3c);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x204d46);
  Launcher::getCompiler(in_stack_ffffffffffffff68);
  this_00 = (Launcher *)&stack0xffffffffffffffd8;
  std::shared_ptr<QueryCompiler>::operator=
            ((shared_ptr<QueryCompiler> *)this_01,(shared_ptr<QueryCompiler> *)this_00);
  std::shared_ptr<QueryCompiler>::~shared_ptr((shared_ptr<QueryCompiler> *)0x204d75);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x204d7f);
  Launcher::getTreeDecomposition(this_00);
  std::shared_ptr<TreeDecomposition>::operator=
            ((shared_ptr<TreeDecomposition> *)this_01,(shared_ptr<TreeDecomposition> *)this_00);
  std::shared_ptr<TreeDecomposition>::~shared_ptr((shared_ptr<TreeDecomposition> *)0x204dae);
  return;
}

Assistant:

RegressionTree::RegressionTree(shared_ptr<Launcher> launcher, bool classification) :
    _classification(classification)
{
    _compiler = launcher->getCompiler();
    _td = launcher->getTreeDecomposition();
}